

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dsp_helper.c
# Opt level: O3

target_ulong helper_raddu_l_ob_mips64el(target_ulong rs)

{
  target_ulong tVar1;
  long lVar2;
  DSP64Value ds;
  
  ds = (DSP64Value)rs;
  lVar2 = 0;
  tVar1 = 0;
  do {
    tVar1 = tVar1 + ds.ub[lVar2];
    lVar2 = lVar2 + 1;
  } while (lVar2 != 8);
  return tVar1;
}

Assistant:

target_ulong helper_raddu_l_ob(target_ulong rs)
{
    target_ulong ret = 0;
    DSP64Value ds;
    unsigned int i;

    ds.ul[0] = rs;
    for (i = 0; i < 8; i++) {
        ret += ds.ub[i];
    }
    return ret;
}